

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

int Abc_NodeMakeSCCFree(Abc_Obj_t *pNode)

{
  char *pcVar1;
  int nVars_00;
  uint uVar2;
  int local_44;
  int nCount;
  int Status;
  int nVars;
  char *pSopNew;
  char *pCube2;
  char *pCube;
  char *pSop;
  Abc_Obj_t *pNode_local;
  
  pcVar1 = (char *)(pNode->field_5).pData;
  nVars_00 = Abc_ObjFaninNum(pNode);
  local_44 = 0;
  for (pCube2 = pcVar1; *pCube2 != '\0'; pCube2 = pCube2 + (nVars_00 + 3)) {
    for (pSopNew = pCube2 + (long)nVars_00 + 3; *pSopNew != '\0'; pSopNew = pSopNew + (nVars_00 + 3)
        ) {
      if ((*pCube2 != 'z') && (*pSopNew != 'z')) {
        uVar2 = Abc_CubeContain(pCube2,pSopNew,nVars_00);
        local_44 = (uint)(0 < (int)uVar2) + local_44;
        if ((uVar2 & 1) == 0) {
          if ((uVar2 & 2) != 0) {
            *pCube2 = 'z';
          }
        }
        else {
          *pSopNew = 'z';
        }
      }
    }
  }
  if (local_44 == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    _Status = (undefined1 *)(pNode->field_5).pData;
    for (pCube2 = pcVar1; *pCube2 != '\0'; pCube2 = pCube2 + (nVars_00 + 3)) {
      if (*pCube2 != 'z') {
        memcpy(_Status,pCube2,(long)(nVars_00 + 3));
        _Status = _Status + (nVars_00 + 3);
      }
    }
    *_Status = 0;
    pNode_local._4_4_ = 1;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeMakeSCCFree( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2, * pSopNew;
    int nVars = Abc_ObjFaninNum(pNode);
    int Status, nCount = 0;
    Abc_SopForEachCubePair( pSop, nVars, pCube, pCube2 )
    {
        if ( pCube[0] == 'z' || pCube2[0] == 'z' )
            continue;
        Status = Abc_CubeContain( pCube, pCube2, nVars );
        nCount += (int)(Status > 0);
        if ( Status & 1 )
            pCube2[0] = 'z';
        else if ( Status & 2 )
            pCube[0] = 'z';
    }
    if ( nCount == 0 )
        return 0;
    // create new cover
    pSopNew = (char *)pNode->pData;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[0] == 'z' )
            continue;
        memcpy( pSopNew, pCube, nVars + 3 );
        pSopNew += nVars + 3;
    }
    *pSopNew = 0;
    return 1;
}